

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command-direct-setter.h
# Opt level: O0

DirectSetter<dynamicgraph::Tracer,_int> * __thiscall
dynamicgraph::command::DirectSetter<dynamicgraph::Tracer,_int>::doExecute
          (DirectSetter<dynamicgraph::Tracer,_int> *this)

{
  int iVar1;
  long in_RSI;
  EitherType local_30 [12];
  int local_24;
  vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_> *pvStack_20;
  int val;
  vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_> *values;
  DirectSetter<dynamicgraph::Tracer,_int> *this_local;
  
  this_local = this;
  pvStack_20 = (vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>
                *)dynamicgraph::command::Command::getParameterValues();
  std::vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>::
  operator[](pvStack_20,0);
  dynamicgraph::command::Value::value();
  iVar1 = dynamicgraph::command::EitherType::operator_cast_to_int(local_30);
  dynamicgraph::command::EitherType::~EitherType(local_30);
  **(int **)(in_RSI + 0x60) = iVar1;
  local_24 = iVar1;
  dynamicgraph::command::Value::Value((Value *)this);
  return this;
}

Assistant:

virtual Value doExecute() {
    const std::vector<Value> &values = getParameterValues();
    T val = values[0].value();
    (*T_ptr) = val;
    return Value();  // void
  }